

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O3

void __thiscall
dynamicgraph::SignalBase<int>::ExtractNodeAndLocalNames
          (SignalBase<int> *this,string *LocalName,string *NodeName)

{
  pointer pcVar1;
  string fullname;
  long *local_68 [2];
  long local_58 [2];
  long *local_48 [2];
  long local_38 [2];
  
  pcVar1 = (this->name)._M_dataplus._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + (this->name)._M_string_length);
  std::__cxx11::string::rfind((char *)local_48,0x120462,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)local_68,(ulong)local_48);
  std::__cxx11::string::operator=((string *)LocalName,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  std::__cxx11::string::find((char *)local_48,0x120e6b,0);
  std::__cxx11::string::find((char *)local_48,0x121656,0);
  std::__cxx11::string::substr((ulong)local_68,(ulong)local_48);
  std::__cxx11::string::operator=((string *)NodeName,(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

virtual void ExtractNodeAndLocalNames(std::string &LocalName,
                                        std::string &NodeName) const {
    std::string fullname = this->getName();

    size_t IdxPosLocalName = fullname.rfind(":");
    LocalName = fullname.substr(IdxPosLocalName + 1,
                                fullname.length() - IdxPosLocalName + 1);
    size_t IdxPosNodeNameStart = fullname.find("(");
    size_t IdxPosNodeNameEnd = fullname.find(")");
    NodeName = fullname.substr(IdxPosNodeNameStart + 1,
                               IdxPosNodeNameEnd - IdxPosNodeNameStart - 1);
  }